

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O3

bool __thiscall cmFileTimeCache::DifferS(cmFileTimeCache *this,string *f1,string *f2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  cmFileTime ft2;
  cmFileTime ft1;
  cmFileTime local_28;
  cmFileTime local_20;
  
  local_20.NS = 0;
  local_28.NS = 0;
  bVar1 = Load(this,f1,&local_20);
  bVar4 = true;
  if (bVar1) {
    bVar1 = Load(this,f2,&local_28);
    if (bVar1) {
      uVar2 = local_20.NS - local_28.NS;
      uVar3 = -uVar2;
      if (0 < (long)uVar2) {
        uVar3 = uVar2;
      }
      bVar4 = 999999999 < uVar3;
    }
  }
  return bVar4;
}

Assistant:

bool cmFileTimeCache::DifferS(std::string const& f1, std::string const& f2)
{
  // Get the modification time for each file.
  cmFileTime ft1, ft2;
  if (this->Load(f1, ft1) && this->Load(f2, ft2)) {
    // Compare the two modification times.
    return ft1.DifferS(ft2);
  }
  // No comparison available.  Default to different times.
  return true;
}